

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

size_t __thiscall TestRange<unsigned_long>::getSteps(TestRange<unsigned_long> *this)

{
  ulong uVar1;
  int *in_RDI;
  __type _Var2;
  __type _Var3;
  double dVar4;
  double steps_double;
  ssize_t coe;
  size_type local_8;
  
  if (*in_RDI == 1) {
    local_8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2));
  }
  else if (*in_RDI == 2) {
    local_8 = (ulong)(*(long *)(in_RDI + 10) - *(long *)(in_RDI + 8)) / *(ulong *)(in_RDI + 0xc) + 1
    ;
  }
  else if (*in_RDI == 3) {
    _Var2 = std::log<long>(0x113d2a);
    _Var3 = std::log<unsigned_long>(0x113d3e);
    dVar4 = _Var2 / _Var3 + 1.0;
    uVar1 = (ulong)dVar4;
    local_8 = uVar1 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t getSteps() {
        if (type == RangeType::ARRAY) {
            return array.size();
        } else if (type == RangeType::LINEAR) {
            return ((end - begin) / step) + 1;
        } else if (type == RangeType::EXPONENTIAL) {
            ssize_t coe = ((ssize_t)end) / ((ssize_t)begin);
            double steps_double = (double)std::log(coe) / std::log(step);
            return (size_t)(steps_double + 1);
        }

        return 0;
    }